

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Int FT_Get_Charmap_Index(FT_CharMap charmap)

{
  uint uVar1;
  FT_Face pFVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffff;
  if ((charmap != (FT_CharMap)0x0) && (pFVar2 = charmap->face, pFVar2 != (FT_Face)0x0)) {
    uVar1 = pFVar2->num_charmaps;
    if ((int)uVar1 < 1) {
      return 0;
    }
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (pFVar2->charmaps[uVar3] == charmap) break;
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)uVar1;
    } while (uVar1 != uVar3);
  }
  return (FT_Int)uVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Int )
  FT_Get_Charmap_Index( FT_CharMap  charmap )
  {
    FT_Int  i;


    if ( !charmap || !charmap->face )
      return -1;

    for ( i = 0; i < charmap->face->num_charmaps; i++ )
      if ( charmap->face->charmaps[i] == charmap )
        break;

    FT_ASSERT( i < charmap->face->num_charmaps );

    return i;
  }